

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O1

void Ivy_ManHaigCreateObj(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  Ivy_Man_t *p_00;
  uint uVar1;
  Ivy_Obj_t *pIVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  p_00 = p->pHaig;
  if (p_00 == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyHaig.c"
                  ,0xba,"void Ivy_ManHaigCreateObj(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyHaig.c"
                  ,0xbb,"void Ivy_ManHaigCreateObj(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  uVar1 = *(uint *)&pObj->field_0x8 & 0xf;
  if (uVar1 == 4) {
    uVar3 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
    if (uVar3 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar3 + 0x48);
    }
    uVar6 = uVar3 & 0xfffffffffffffffe;
    uVar4 = *(ulong *)(uVar6 + 0x48);
    if ((uVar4 != 0) && (uVar5 = uVar4, *(int *)(uVar6 + 0xc) < 1)) {
      for (; (uVar5 = uVar5 & 0xfffffffffffffffe, uVar5 != uVar6 && (*(int *)(uVar5 + 0xc) < 1));
          uVar5 = *(ulong *)(uVar5 + 0x48)) {
      }
      if (*(int *)(uVar5 + 0xc) < 1) {
LAB_007567b6:
        __assert_fail("Ivy_ObjRefs(pTemp) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyHaig.c"
                      ,0x3b,"Ivy_Obj_t *Ivy_HaigObjRepr(Ivy_Obj_t *)");
      }
      uVar6 = uVar5 | (uint)uVar4 & 1;
    }
    pIVar2 = Ivy_Latch(p_00,(Ivy_Obj_t *)((uint)uVar3 & 1 ^ uVar6),
                       *(uint *)&pObj->field_0x8 >> 9 & IVY_INIT_DC);
  }
  else if (uVar1 == 5) {
    uVar3 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
    if (uVar3 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar3 + 0x48);
    }
    uVar6 = uVar3 & 0xfffffffffffffffe;
    uVar4 = *(ulong *)(uVar6 + 0x48);
    if ((uVar4 != 0) && (uVar5 = uVar4, *(int *)(uVar6 + 0xc) < 1)) {
      for (; (uVar5 = uVar5 & 0xfffffffffffffffe, uVar5 != uVar6 && (*(int *)(uVar5 + 0xc) < 1));
          uVar5 = *(ulong *)(uVar5 + 0x48)) {
      }
      if (*(int *)(uVar5 + 0xc) < 1) goto LAB_007567b6;
      uVar6 = uVar5 | (uint)uVar4 & 1;
    }
    uVar4 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar4 + 0x48);
    }
    uVar7 = uVar4 & 0xfffffffffffffffe;
    uVar5 = *(ulong *)(uVar7 + 0x48);
    if ((uVar5 != 0) && (uVar8 = uVar5, *(int *)(uVar7 + 0xc) < 1)) {
      for (; (uVar8 = uVar8 & 0xfffffffffffffffe, uVar8 != uVar7 && (*(int *)(uVar8 + 0xc) < 1));
          uVar8 = *(ulong *)(uVar8 + 0x48)) {
      }
      if (*(int *)(uVar8 + 0xc) < 1) goto LAB_007567b6;
      uVar7 = uVar8 | (uint)uVar5 & 1;
    }
    pIVar2 = Ivy_And(p_00,(Ivy_Obj_t *)(uVar6 ^ (uint)uVar3 & 1),
                     (Ivy_Obj_t *)((uint)uVar4 & 1 ^ uVar7));
  }
  else {
    if (uVar1 != 7) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyHaig.c"
                    ,0xce,"void Ivy_ManHaigCreateObj(Ivy_Man_t *, Ivy_Obj_t *)");
    }
    uVar3 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
    if (uVar3 == 0) {
      pIVar2 = (Ivy_Obj_t *)0x0;
    }
    else {
      pIVar2 = (Ivy_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar3 + 0x48));
    }
  }
  pObj->pEquiv = pIVar2;
  return;
}

Assistant:

void Ivy_ManHaigCreateObj( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pEquiv0, * pEquiv1;
    assert( p->pHaig != NULL );
    assert( !Ivy_IsComplement(pObj) );
    if ( Ivy_ObjType(pObj) == IVY_BUF )
        pObj->pEquiv = Ivy_ObjChild0Equiv(pObj);
    else if ( Ivy_ObjType(pObj) == IVY_LATCH )
    {
//        pObj->pEquiv = Ivy_Latch( p->pHaig, Ivy_ObjChild0Equiv(pObj), pObj->Init );
        pEquiv0 = Ivy_ObjChild0Equiv(pObj);
        pEquiv0 = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pEquiv0)), Ivy_IsComplement(pEquiv0) );
        pObj->pEquiv = Ivy_Latch( p->pHaig, pEquiv0, (Ivy_Init_t)pObj->Init );
    }
    else if ( Ivy_ObjType(pObj) == IVY_AND )
    {
//        pObj->pEquiv = Ivy_And( p->pHaig, Ivy_ObjChild0Equiv(pObj), Ivy_ObjChild1Equiv(pObj) );
        pEquiv0 = Ivy_ObjChild0Equiv(pObj);
        pEquiv0 = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pEquiv0)), Ivy_IsComplement(pEquiv0) );
        pEquiv1 = Ivy_ObjChild1Equiv(pObj);
        pEquiv1 = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pEquiv1)), Ivy_IsComplement(pEquiv1) );
        pObj->pEquiv = Ivy_And( p->pHaig, pEquiv0, pEquiv1 );
    }
    else assert( 0 );
    // make sure the node points to the representative
//    pObj->pEquiv = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pObj->pEquiv)), Ivy_IsComplement(pObj->pEquiv) );
}